

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

c_int * csc_pinv(c_int *p,c_int n)

{
  long in_RSI;
  long in_RDI;
  c_int *pinv;
  c_int k;
  c_int in_stack_ffffffffffffffd8;
  c_int in_stack_ffffffffffffffe0;
  long lVar1;
  c_int *local_8;
  
  if (in_RDI == 0) {
    local_8 = (c_int *)0x0;
  }
  else {
    local_8 = (c_int *)csc_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (local_8 == (c_int *)0x0) {
      local_8 = (c_int *)0x0;
    }
    else {
      for (lVar1 = 0; lVar1 < in_RSI; lVar1 = lVar1 + 1) {
        local_8[*(long *)(in_RDI + lVar1 * 8)] = lVar1;
      }
    }
  }
  return local_8;
}

Assistant:

c_int* csc_pinv(c_int const *p, c_int n) {
  c_int k, *pinv;

  if (!p) return OSQP_NULL;                /* p = OSQP_NULL denotes identity */

  pinv = csc_malloc(n, sizeof(c_int));     /* allocate result */

  if (!pinv) return OSQP_NULL;             /* out of memory */

  for (k = 0; k < n; k++) pinv[p[k]] = k;  /* invert the permutation */
  return pinv;                             /* return result */
}